

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc)

{
  pointer *this_00;
  cmMakefileTargetGenerator *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  cmGeneratorTarget *this_01;
  string *filename;
  char *pcVar4;
  string local_1e8;
  string local_1c8;
  allocator local_1a1;
  undefined1 local_1a0 [8];
  string copyCommand;
  undefined1 local_178 [8];
  string copyEcho;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_120;
  string local_100;
  allocator local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string output;
  string *input;
  string macdir;
  char *pkgloc_local;
  cmSourceFile *source_local;
  MacOSXContentGeneratorType *this_local;
  
  macdir.field_2._8_8_ = pkgloc;
  this_01 = GetGeneratorTarget(this->Generator);
  bVar3 = cmGeneratorTarget::IsBundleOnApple(this_01);
  if (bVar3) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
              ((string *)&input,this->Generator->OSXBundleGenerator,(char *)macdir.field_2._8_8_);
    filename = cmSourceFile::GetFullPath_abi_cxx11_(source);
    std::__cxx11::string::string((string *)local_78,(string *)&input);
    std::__cxx11::string::operator+=((string *)local_78,"/");
    cmsys::SystemTools::GetFilenameName(&local_98,filename);
    std::__cxx11::string::operator+=((string *)local_78,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    pcVar1 = this->Generator;
    pcVar2 = pcVar1->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,pcVar4,&local_d9);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_b8,pcVar2,&local_d8,(string *)local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar1->CleanFiles,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    pcVar2 = this->Generator->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_120,pcVar4,
               (allocator *)
               ((long)&depends.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_100,pcVar2,&local_120,(string *)local_78);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&depends.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this_00 = &commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&copyEcho.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_178,"Copying OS X content ",
               (allocator *)(copyCommand.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(copyCommand.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_178,(string *)local_78);
    cmLocalUnixMakefileGenerator3::AppendEcho
              (this->Generator->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&copyEcho.field_2 + 8),(string *)local_178,EchoBuild,(EchoProgress *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1a0,"$(CMAKE_COMMAND) -E copy ",&local_1a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    cmOutputConverter::ConvertToOutputFormat
              (&local_1c8,
               &(this->Generator->LocalGenerator->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,filename,SHELL);
    std::__cxx11::string::operator+=((string *)local_1a0,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::operator+=((string *)local_1a0," ");
    cmOutputConverter::ConvertToOutputFormat
              (&local_1e8,
               &(this->Generator->LocalGenerator->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,(string *)local_78,SHELL);
    std::__cxx11::string::operator+=((string *)local_1a0,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&copyEcho.field_2 + 8),(value_type *)local_1a0);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->Generator->LocalGenerator,(ostream *)this->Generator->BuildFileStream,
               (char *)0x0,(string *)local_78,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&copyEcho.field_2 + 8),false,false);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->Generator->ExtraFiles,(value_type *)local_78);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&copyEcho.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&input);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc);

  // Get the input file location.
  std::string const& input = source.GetFullPath();

  // Get the output file location.
  std::string output = macdir;
  output += "/";
  output += cmSystemTools::GetFilenameName(input);
  this->Generator->CleanFiles.push_back(
    this->Generator->LocalGenerator->MaybeConvertToRelativePath(
      this->Generator->LocalGenerator->GetCurrentBinaryDirectory(), output));
  output = this->Generator->LocalGenerator->MaybeConvertToRelativePath(
    this->Generator->LocalGenerator->GetBinaryDirectory(), output);

  // Create a rule to copy the content into the bundle.
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  depends.push_back(input);
  std::string copyEcho = "Copying OS X content ";
  copyEcho += output;
  this->Generator->LocalGenerator->AppendEcho(
    commands, copyEcho, cmLocalUnixMakefileGenerator3::EchoBuild);
  std::string copyCommand = "$(CMAKE_COMMAND) -E copy ";
  copyCommand += this->Generator->LocalGenerator->ConvertToOutputFormat(
    input, cmOutputConverter::SHELL);
  copyCommand += " ";
  copyCommand += this->Generator->LocalGenerator->ConvertToOutputFormat(
    output, cmOutputConverter::SHELL);
  commands.push_back(copyCommand);
  this->Generator->LocalGenerator->WriteMakeRule(
    *this->Generator->BuildFileStream, CM_NULLPTR, output, depends, commands,
    false);
  this->Generator->ExtraFiles.insert(output);
}